

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O2

bool __thiscall Rml::DataParser::Parse(DataParser *this,bool is_assignment_expression)

{
  char cVar1;
  bool *out_valid_function_name;
  byte bVar2;
  allocator<char> local_71;
  String variable_name;
  String local_50;
  
  ::std::vector<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>::clear(&this->program);
  ::std::
  vector<std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>,_std::allocator<std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>
  ::clear(&this->variable_addresses);
  this->index = 0;
  this->reached_end = false;
  this->parse_error = false;
  if ((this->expression)._M_string_length == 0) {
    this->reached_end = true;
  }
  SkipWhitespace(this);
  if (is_assignment_expression) {
    do {
      bVar2 = this->reached_end;
      if (((bool)bVar2 == false) &&
         (out_valid_function_name = (bool *)(this->expression)._M_dataplus._M_p,
         out_valid_function_name[this->index] != false)) {
        Rml::Parse::VariableOrFunctionName_abi_cxx11_
                  (&variable_name,(Parse *)this,(DataParser *)0x0,out_valid_function_name);
        if (variable_name._M_string_length == 0) {
          ::std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_50,"Expected a variable for assignment but got an empty name."
                     ,&local_71);
          Error(this,&local_50);
LAB_002617fd:
          ::std::__cxx11::string::~string((string *)&local_50);
          goto LAB_00261807;
        }
        SkipWhitespace(this);
        if ((((this->reached_end == false) &&
             (cVar1 = (this->expression)._M_dataplus._M_p[this->index], cVar1 != '\0')) &&
            (cVar1 != '(')) && (cVar1 != ';')) {
          if (cVar1 != '=') {
            ::std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_50,"one of  = ; (  or end of string",&local_71);
            Expected(this,&local_50);
            goto LAB_002617fd;
          }
          Match(this,'=',true);
          Rml::Parse::Expression(this);
          Assign(this,&variable_name);
        }
        else {
          Rml::Parse::Function(this,EventFnc,&variable_name,false);
        }
        ::std::__cxx11::string::~string((string *)&variable_name);
        bVar2 = this->reached_end;
      }
      if ((bVar2 & 1) != 0) goto LAB_00261811;
      cVar1 = (this->expression)._M_dataplus._M_p[this->index];
      if (cVar1 != ';') goto LAB_002617b1;
      Match(this,';',true);
    } while( true );
  }
  Rml::Parse::Expression(this);
LAB_00261811:
  if (this->reached_end == false) {
    this->parse_error = true;
    CreateString_abi_cxx11_
              (&variable_name,"Unexpected character \'%c\' encountered.",
               (ulong)(uint)(int)(this->expression)._M_dataplus._M_p[this->index]);
    Error(this,&variable_name);
    ::std::__cxx11::string::~string((string *)&variable_name);
  }
  if (this->parse_error == false) {
    if (this->program_stack_size == 0) {
      bVar2 = 1;
    }
    else {
      this->parse_error = true;
      CreateString_abi_cxx11_
                (&variable_name,
                 "Internal parser error, inconsistent stack operations. Stack size is %d at parse end."
                );
      Error(this,&variable_name);
      ::std::__cxx11::string::~string((string *)&variable_name);
      bVar2 = this->parse_error ^ 1;
    }
  }
  else {
    bVar2 = 0;
  }
  return (bool)(bVar2 & 1);
LAB_002617b1:
  if (cVar1 != '\0') {
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&variable_name,"\';\' or end of string",(allocator<char> *)&local_50);
    Expected(this,&variable_name);
LAB_00261807:
    ::std::__cxx11::string::~string((string *)&variable_name);
  }
  goto LAB_00261811;
}

Assistant:

bool Parse(bool is_assignment_expression)
	{
		program.clear();
		variable_addresses.clear();
		index = 0;
		reached_end = false;
		parse_error = false;
		if (expression.empty())
			reached_end = true;

		SkipWhitespace();

		if (is_assignment_expression)
			Parse::Assignment(*this);
		else
			Parse::Expression(*this);

		if (!reached_end)
		{
			parse_error = true;
			Error(CreateString("Unexpected character '%c' encountered.", Look()));
		}
		if (!parse_error && program_stack_size != 0)
		{
			parse_error = true;
			Error(CreateString("Internal parser error, inconsistent stack operations. Stack size is %d at parse end.", program_stack_size));
		}

		return !parse_error;
	}